

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# data-source.cc
# Opt level: O1

Animation __thiscall
DataSourceBase::get_animation(DataSourceBase *this,size_t animation,size_t phase)

{
  pointer pvVar1;
  long lVar2;
  Stream *pSVar3;
  undefined8 uVar4;
  int iVar6;
  ulong uVar5;
  ulong uVar7;
  Animation AVar8;
  Stream SStack_58;
  size_type *local_50 [2];
  size_type local_40 [2];
  
  uVar7 = phase >> 3;
  pvVar1 = (this->animation_table).
           super__Vector_base<std::vector<Data::Animation,_std::allocator<Data::Animation>_>,_std::allocator<std::vector<Data::Animation,_std::allocator<Data::Animation>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  uVar5 = ((long)(this->animation_table).
                 super__Vector_base<std::vector<Data::Animation,_std::allocator<Data::Animation>_>,_std::allocator<std::vector<Data::Animation,_std::allocator<Data::Animation>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish - (long)pvVar1 >> 3) *
          -0x5555555555555555;
  if ((uVar5 < animation || uVar5 - animation == 0) ||
     (lVar2 = *(long *)&pvVar1[animation].
                        super__Vector_base<Data::Animation,_std::allocator<Data::Animation>_>.
                        _M_impl.super__Vector_impl_data,
     (ulong)(((long)*(pointer *)
                     ((long)&pvVar1[animation].
                             super__Vector_base<Data::Animation,_std::allocator<Data::Animation>_>.
                             _M_impl.super__Vector_impl_data + 8) - lVar2 >> 2) *
            -0x5555555555555555) <= uVar7)) {
    local_50[0] = local_40;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_50,"data","");
    Log::Logger::operator[]((Logger *)&SStack_58,(string *)&Log::Error);
    pSVar3 = Log::Stream::operator<<(&SStack_58,"Failed to get animation #");
    std::ostream::_M_insert<unsigned_long>((ulong)pSVar3->stream);
    pSVar3 = Log::Stream::operator<<(pSVar3," phase #");
    std::ostream::_M_insert<unsigned_long>((ulong)pSVar3->stream);
    pSVar3 = Log::Stream::operator<<(pSVar3," (got only ");
    std::ostream::_M_insert<unsigned_long>((ulong)pSVar3->stream);
    Log::Stream::operator<<(pSVar3," phases)");
    Log::Stream::~Stream(&SStack_58);
    if (local_50[0] != local_40) {
      operator_delete(local_50[0],local_40[0] + 1);
    }
    iVar6 = 0;
    uVar4 = 0;
  }
  else {
    uVar4 = *(undefined8 *)(lVar2 + uVar7 * 0xc);
    iVar6 = *(int *)(lVar2 + 8 + uVar7 * 0xc);
  }
  AVar8.y = iVar6;
  AVar8.sprite = (char)uVar4;
  AVar8._1_3_ = (int3)((ulong)uVar4 >> 8);
  AVar8.x = (int)((ulong)uVar4 >> 0x20);
  return AVar8;
}

Assistant:

Data::Animation
DataSourceBase::get_animation(size_t animation, size_t phase) {
  phase >>= 3;
  if ((animation >= animation_table.size()) ||
      (phase >= animation_table[animation].size())) {
    Log::Error["data"] << "Failed to get animation #" << animation
    << " phase #" << phase
    << " (got only " << animation_table[animation].size()
    << " phases)";
    return {0, 0, 0};
  }

  return animation_table[animation][phase];
}